

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeNone(AsciiParser *this)

{
  bool bVar1;
  uint64_t pos;
  reference pvVar2;
  uint64_t loc;
  vector<char,_std::allocator<char>_> buf;
  AsciiParser *this_local;
  
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = this;
  ::std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&loc);
  pos = CurrLoc(this);
  bVar1 = CharN(this,4,(vector<char,_std::allocator<char>_> *)&loc);
  if (bVar1) {
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)&loc,0);
    if (*pvVar2 == 'N') {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)&loc,1);
      if (*pvVar2 == 'o') {
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&loc,2);
        if (*pvVar2 == 'n') {
          pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)&loc,3);
          if (*pvVar2 == 'e') {
            this_local._7_1_ = true;
            goto LAB_004ec646;
          }
        }
      }
    }
    SeekTo(this,pos);
    this_local._7_1_ = false;
  }
  else {
    SeekTo(this,pos);
    this_local._7_1_ = false;
  }
LAB_004ec646:
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&loc);
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::MaybeNone() {
  std::vector<char> buf;

  auto loc = CurrLoc();

  if (!CharN(4, &buf)) {
    SeekTo(loc);
    return false;
  }

  if ((buf[0] == 'N') && (buf[1] == 'o') && (buf[2] == 'n') &&
      (buf[3] == 'e')) {
    // got it
    return true;
  }

  SeekTo(loc);

  return false;
}